

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_client.hpp
# Opt level: O1

Lazy<cinatra::resp_data> __thiscall
cinatra::coro_http_client::write_websocket<std::span<char,18446744073709551615ul>>
          (coro_http_client *this,span<char,_18446744073709551615UL> source,opcode op)

{
  element_type *peVar1;
  undefined7 in_register_00000009;
  undefined1 in_R8B;
  
  peVar1 = (element_type *)operator_new(0x160,(nothrow_t *)&std::nothrow);
  if (peVar1 == (element_type *)0x0) {
    (this->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
    super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  else {
    *(code **)&(peVar1->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
               super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2> =
         write_websocket<std::span<char,18446744073709551615ul>>;
    ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
    ((long)&(peVar1->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
            super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2> + 8))->_M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         write_websocket<std::span<char,18446744073709551615ul>>;
    *(undefined1 *)((long)(peVar1->parser_).headers_._M_elems + 0x111) = in_R8B;
    *(char **)((long)(peVar1->parser_).headers_._M_elems + 0x108) =
         (char *)CONCAT71(in_register_00000009,op);
    (((http_header *)((long)(peVar1->parser_).headers_._M_elems + 0x100))->name)._M_len =
         source._M_extent._M_extent_value._M_extent_value;
    *(pointer *)((long)(peVar1->parser_).headers_._M_elems + 0xf8) = source._M_ptr;
    *(undefined8 *)&peVar1->parser_ = 0;
    (peVar1->parser_).msg_._M_len = 0;
    (peVar1->parser_).msg_._M_str = (char *)0x0;
    *(undefined1 *)((long)(peVar1->parser_).headers_._M_elems + 0x18) = 0;
    (this->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
    super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
    *(undefined1 *)&((string_view *)((long)(peVar1->parser_).headers_._M_elems + 0x110))->_M_len = 0
    ;
  }
  return (LazyBase<cinatra::resp_data,_false>)(LazyBase<cinatra::resp_data,_false>)this;
}

Assistant:

async_simple::coro::Lazy<resp_data> write_websocket(
      Source source, opcode op = opcode::text) {
    resp_data data{};

    websocket ws{};
    std::string close_str;
    if (op == opcode::close) {
      if constexpr (is_span_v<Source>) {
        close_str = ws.format_close_payload(close_code::normal, source.data(),
                                            source.size());
        source = {close_str.data(), close_str.size()};
      }
    }

    std::span<char> span{};
    if constexpr (is_span_v<Source>) {
      span = {source.data(), source.size()};
#ifdef CINATRA_ENABLE_GZIP
      std::string dest_buf;
      if (enable_ws_deflate_) {
        gzip_compress({source.data(), source.size()}, dest_buf, span, data);
      }
#endif
      co_await write_ws_frame(span, ws, op, data, true);
    }
    else {
      while (true) {
        auto result = co_await source();
        span = {result.buf.data(), result.buf.size()};
#ifdef CINATRA_ENABLE_GZIP
        std::string dest_buf;
        if (enable_ws_deflate_) {
          gzip_compress({result.buf.data(), result.buf.size()}, dest_buf, span,
                        data);
        }
#endif
        co_await write_ws_frame(span, ws, op, data, result.eof);

        if (result.eof || data.status == 404) {
          break;
        }
      }
    }

    co_return data;
  }